

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestDouble_IsDenormal(void)

{
  bool in_CL;
  
  CheckHelper((char *)0x81,0xc1c3a4,(char *)0x1,in_CL);
  CheckHelper((char *)0x83,0xc1c3c7,(char *)0x1,in_CL);
  CheckHelper((char *)0x85,0xc1c3c6,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Double_IsDenormal) {
  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  CHECK(Double(min_double64).IsDenormal());
  uint64_t bits = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  CHECK(Double(bits).IsDenormal());
  bits = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  CHECK(!Double(bits).IsDenormal());
}